

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfedge.cpp
# Opt level: O1

void graphics101::unordered_edges_from_triangles
               (vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_> *triangles,
               Edges *edges_out)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  int iVar3;
  pointer pTVar4;
  pointer pvVar5;
  int iVar6;
  _Base_ptr p_Var7;
  Triangle *tri;
  pointer pTVar8;
  ulong uVar9;
  edge_set_t edges;
  pair<long,_long> local_70;
  _Rb_tree<std::pair<long,_long>,_std::pair<long,_long>,_std::_Identity<std::pair<long,_long>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
  local_60;
  
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pTVar8 = (triangles->
           super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pTVar4 = (triangles->
           super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (pTVar8 != pTVar4) {
    do {
      iVar2 = pTVar8->A;
      iVar3 = pTVar8->B;
      iVar6 = iVar3;
      if (iVar3 < iVar2) {
        iVar6 = iVar2;
        iVar2 = iVar3;
      }
      local_70.first = (long)iVar2;
      local_70.second = (long)iVar6;
      std::
      _Rb_tree<std::pair<long,long>,std::pair<long,long>,std::_Identity<std::pair<long,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>>
      ::_M_insert_unique<std::pair<long,long>>
                ((_Rb_tree<std::pair<long,long>,std::pair<long,long>,std::_Identity<std::pair<long,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>>
                  *)&local_60,&local_70);
      iVar2 = pTVar8->B;
      iVar3 = pTVar8->C;
      iVar6 = iVar3;
      if (iVar3 < iVar2) {
        iVar6 = iVar2;
        iVar2 = iVar3;
      }
      local_70.first = (long)iVar2;
      local_70.second = (long)iVar6;
      std::
      _Rb_tree<std::pair<long,long>,std::pair<long,long>,std::_Identity<std::pair<long,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>>
      ::_M_insert_unique<std::pair<long,long>>
                ((_Rb_tree<std::pair<long,long>,std::pair<long,long>,std::_Identity<std::pair<long,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>>
                  *)&local_60,&local_70);
      iVar2 = pTVar8->A;
      iVar3 = pTVar8->C;
      iVar6 = iVar2;
      if (iVar2 < iVar3) {
        iVar6 = iVar3;
        iVar3 = iVar2;
      }
      local_70.first = (long)iVar3;
      local_70.second = (long)iVar6;
      std::
      _Rb_tree<std::pair<long,long>,std::pair<long,long>,std::_Identity<std::pair<long,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>>
      ::_M_insert_unique<std::pair<long,long>>
                ((_Rb_tree<std::pair<long,long>,std::pair<long,long>,std::_Identity<std::pair<long,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>>
                  *)&local_60,&local_70);
      pTVar8 = pTVar8 + 1;
    } while (pTVar8 != pTVar4);
  }
  std::
  vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
  ::resize(edges_out,local_60._M_impl.super__Rb_tree_header._M_node_count);
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    uVar9 = 0;
    p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      pvVar5 = (edges_out->
               super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(edges_out->
                        super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5 >> 3) <= uVar9) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9
                  );
      }
      pvVar5[uVar9] =
           (vec<2,_int,_(glm::qualifier)0>)
           ((long)p_Var7[1]._M_parent << 0x20 | (ulong)p_Var7[1]._M_color);
      uVar9 = uVar9 + 1;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var1);
  }
  std::
  _Rb_tree<std::pair<long,_long>,_std::pair<long,_long>,_std::_Identity<std::pair<long,_long>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void unordered_edges_from_triangles( const std::vector< Triangle >& triangles, HalfEdgeTriMesh::Edges& edges_out )
{
    typedef HalfEdgeTriMesh::Index Index;
    typedef HalfEdgeTriMesh::Edge Edge;
    typedef std::set< std::pair< Index, Index > > edge_set_t;
    edge_set_t edges;
    for( const auto& tri : triangles )
    {
        edges.insert( std::make_pair( std::min( tri[0], tri[1] ), std::max( tri[0], tri[1] ) ) );
        edges.insert( std::make_pair( std::min( tri[1], tri[2] ), std::max( tri[1], tri[2] ) ) );
        edges.insert( std::make_pair( std::min( tri[2], tri[0] ), std::max( tri[2], tri[0] ) ) );
    }

    edges_out.resize( edges.size() );
    int e = 0;
    for( const auto& it : edges )
    {
        edges_out.at(e) = Edge( it.first, it.second );
        ++e;
    }
}